

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::MpRepeatedFixed<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  unsigned_long uVar1;
  ushort uVar2;
  uint uVar3;
  FieldEntry *pFVar4;
  char *pcVar5;
  void *x;
  RepeatedField<unsigned_long> *this;
  pointer puVar6;
  Nullable<const_char_*> failure_msg;
  RepeatedField<unsigned_int> *this_00;
  pointer puVar7;
  ulong uVar8;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  uint *puVar9;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar10;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *ctx_00;
  unsigned_long *p;
  uint32_t *ptr_00;
  uint uVar11;
  unsigned_short local_42;
  uint32_t next_tag;
  
  aVar10 = data.field_0;
  pFVar4 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                     (table,(ulong)data.field_0 >> 0x20);
  uVar3 = data.field_0._0_4_;
  uVar11 = uVar3 & 7;
  if (uVar11 == 2) {
    pcVar5 = MpPackedFixed<true>(msg,ptr,ctx,data,table,hasbits);
    return pcVar5;
  }
  x = MaybeGetSplitBase(msg,true,table);
  if ((pFVar4->type_card & 0x1c0) == 0xc0) {
    if (uVar11 != 1) {
      UNRECOVERED_JUMPTABLE = table->fallback;
      goto LAB_00c93687;
    }
    this = MaybeCreateRepeatedRefAt<google::protobuf::RepeatedField<unsigned_long>,true>
                     (x,(ulong)pFVar4->offset,msg);
    do {
      uVar1 = *(unsigned_long *)ptr;
      puVar6 = RepeatedField<unsigned_long>::Add(this);
      *puVar6 = uVar1;
      p = (unsigned_long *)((long)ptr + 8);
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) goto LAB_00c936c1;
      ptr_00 = &next_tag;
      ptr = ReadTag((char *)p,&next_tag,0);
      ctx_00 = extraout_RDX;
      if ((unsigned_long *)ptr == (unsigned_long *)0x0) {
LAB_00c936d0:
        pcVar5 = Error(msg,(char *)ptr_00,ctx_00,(TcFieldData)aVar10,table,hasbits);
        return pcVar5;
      }
    } while (next_tag == uVar3);
  }
  else {
    next_tag = CONCAT22(next_tag._2_2_,pFVar4->type_card) & 0xffff01c0;
    local_42 = 0x80;
    failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_short,unsigned_short>
                            ((unsigned_short *)&next_tag,&local_42,
                             "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
    if (failure_msg != (Nullable<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&next_tag,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x7b7,failure_msg);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&next_tag);
    }
    if (uVar11 != 5) {
      UNRECOVERED_JUMPTABLE = table->fallback;
      goto LAB_00c93687;
    }
    this_00 = MaybeCreateRepeatedRefAt<google::protobuf::RepeatedField<unsigned_int>,true>
                        (x,(ulong)pFVar4->offset,msg);
    do {
      uVar11 = *(uint *)ptr;
      puVar7 = RepeatedField<unsigned_int>::Add(this_00);
      *puVar7 = uVar11;
      p = (unsigned_long *)((long)ptr + 4);
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) goto LAB_00c936c1;
      ptr_00 = &next_tag;
      ptr = ReadTag((char *)p,&next_tag,0);
      ctx_00 = extraout_RDX_00;
      if ((uint *)ptr == (uint *)0x0) goto LAB_00c936d0;
    } while (next_tag == uVar3);
  }
  if (p < (ctx->super_EpsCopyInputStream).limit_end_) {
    uVar3 = (uint)table->fast_idx_mask & (uint)(ushort)*p;
    if ((uVar3 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar8 = (ulong)(uVar3 & 0xfffffff8);
    data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                   ((ulong)(ushort)*p ^ *(ulong *)(&table[1].fast_idx_mask + uVar8 * 2));
    UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar8);
    ptr = (char *)p;
LAB_00c93687:
    pcVar5 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
    return pcVar5;
  }
  uVar2 = table->has_bits_offset;
LAB_00c9369b:
  if (uVar2 != 0) {
    puVar9 = RefAt<unsigned_int>(msg,(ulong)uVar2);
    *puVar9 = *puVar9 | (uint)hasbits;
  }
  return (char *)p;
LAB_00c936c1:
  uVar2 = table->has_bits_offset;
  goto LAB_00c9369b;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpRepeatedFixed(
    PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  // Check for packed repeated fallback:
  if (decoded_wiretype == WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return MpPackedFixed<is_split>(PROTOBUF_TC_PARAM_PASS);
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  const uint16_t type_card = entry.type_card;
  const uint16_t rep = type_card & field_layout::kRepMask;
  if (rep == field_layout::kRep64Bits) {
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED64) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
    auto& field = MaybeCreateRepeatedFieldRefAt<uint64_t, is_split>(
        base, entry.offset, msg);
    constexpr auto size = sizeof(uint64_t);
    const char* ptr2 = ptr;
    uint32_t next_tag;
    do {
      ptr = ptr2;
      *field.Add() = UnalignedLoad<uint64_t>(ptr);
      ptr += size;
      if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
      ptr2 = ReadTag(ptr, &next_tag);
      if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
    } while (next_tag == decoded_tag);
  } else {
    ABSL_DCHECK_EQ(rep, static_cast<uint16_t>(field_layout::kRep32Bits));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED32) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
    auto& field = MaybeCreateRepeatedFieldRefAt<uint32_t, is_split>(
        base, entry.offset, msg);
    constexpr auto size = sizeof(uint32_t);
    const char* ptr2 = ptr;
    uint32_t next_tag;
    do {
      ptr = ptr2;
      *field.Add() = UnalignedLoad<uint32_t>(ptr);
      ptr += size;
      if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
      ptr2 = ReadTag(ptr, &next_tag);
      if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
    } while (next_tag == decoded_tag);
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}